

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_b44.c
# Opt level: O1

exr_result_t compress_b44_impl(exr_encode_pipeline_t *encode,int flat_field)

{
  int iVar1;
  uint8_t uVar2;
  uint uVar3;
  uint uVar4;
  exr_coding_channel_info_t *peVar5;
  bool bVar6;
  undefined1 auVar7 [14];
  undefined1 auVar8 [14];
  undefined1 auVar9 [14];
  byte bVar10;
  int i_2;
  exr_result_t eVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  ulong uVar15;
  int i;
  uint uVar16;
  int iVar17;
  bool bVar18;
  uint uVar19;
  ulong uVar20;
  long lVar21;
  uint uVar22;
  void *__src;
  undefined8 *puVar23;
  long lVar24;
  ulong uVar25;
  ulong uVar26;
  void *pvVar27;
  int i_3;
  undefined8 *puVar28;
  uint uVar29;
  undefined8 *puVar30;
  long lVar31;
  undefined8 *puVar32;
  uint uVar33;
  size_t sVar34;
  ushort *__dest;
  long lVar35;
  undefined1 auVar36 [12];
  undefined1 auVar37 [12];
  undefined1 auVar38 [16];
  short sVar41;
  short sVar46;
  short sVar47;
  short sVar49;
  undefined4 uVar48;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar45 [16];
  ushort uVar50;
  uint16_t s [16];
  int d [16];
  void *local_1c0;
  undefined8 local_118;
  undefined8 local_110;
  undefined8 local_108;
  undefined8 local_100;
  uint local_f8 [16];
  int local_b8 [16];
  ulong local_78 [4];
  ulong local_58;
  undefined8 *local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  undefined1 auVar39 [16];
  ushort uVar40;
  undefined1 auVar44 [16];
  
  __dest = (ushort *)encode->compressed_buffer;
  eVar11 = internal_encode_alloc_buffer
                     (encode,EXR_TRANSCODE_BUFFER_SCRATCH1,&encode->scratch_buffer_1,
                      &encode->scratch_alloc_size_1,encode->packed_bytes);
  if (eVar11 == 0) {
    if (0 < (encode->chunk).height) {
      __src = encode->packed_buffer;
      uVar25 = 0;
      do {
        uVar16 = (uint)uVar25;
        if (0 < encode->channel_count) {
          iVar14 = (encode->chunk).start_y;
          pvVar27 = encode->scratch_buffer_1;
          lVar24 = 0x19;
          lVar35 = 0;
          do {
            peVar5 = encode->channels;
            sVar34 = (long)*(char *)((long)&peVar5->channel_name + lVar24) *
                     (long)*(int *)((long)peVar5 + lVar24 + -0xd);
            lVar31 = (long)*(int *)((long)peVar5 + lVar24 + -0x11) * sVar34;
            if (lVar31 != 0) {
              uVar3 = *(uint *)((long)peVar5 + lVar24 + -5);
              uVar12 = uVar16;
              if ((int)uVar3 < 2) {
LAB_00105444:
                memcpy((void *)(uVar12 * sVar34 + (long)pvVar27),__src,sVar34);
                __src = (void *)((long)__src + sVar34);
              }
              else if ((int)(iVar14 + uVar16) % (int)uVar3 == 0) {
                uVar12 = (uint)(uVar25 / uVar3);
                goto LAB_00105444;
              }
              pvVar27 = (void *)((long)pvVar27 + lVar31);
            }
            lVar35 = lVar35 + 1;
            lVar24 = lVar24 + 0x30;
          } while (lVar35 < encode->channel_count);
        }
        uVar25 = (ulong)(uVar16 + 1);
      } while ((int)(uVar16 + 1) < (encode->chunk).height);
    }
    bVar6 = 0 < encode->channel_count;
    if (encode->channel_count < 1) {
      uVar25 = 0;
    }
    else {
      local_1c0 = encode->scratch_buffer_1;
      lVar24 = 0;
      uVar25 = 0;
      do {
        peVar5 = encode->channels;
        iVar14 = peVar5[lVar24].width;
        lVar35 = (long)iVar14;
        uVar20 = (ulong)peVar5[lVar24].height;
        sVar34 = uVar20 * lVar35 * (long)peVar5[lVar24].bytes_per_element;
        if (sVar34 == 0) {
          iVar14 = 10;
        }
        else if (peVar5[lVar24].data_type == 1) {
          iVar17 = 0xb;
          if (0 < peVar5[lVar24].height) {
            uVar15 = 0;
            do {
              puVar28 = (undefined8 *)((long)local_1c0 + uVar15 * lVar35 * 2);
              puVar30 = (undefined8 *)((long)puVar28 + lVar35 * 2);
              puVar32 = (undefined8 *)((long)puVar30 + lVar35 * 2);
              if ((uVar15 | 3) < uVar20) {
                puVar23 = (undefined8 *)(lVar35 * 2 + (long)puVar32);
              }
              else {
                if (uVar20 <= (uVar15 | 1)) {
                  puVar30 = puVar28;
                }
                puVar23 = puVar32;
                if (uVar20 <= (uVar15 | 2)) {
                  puVar23 = puVar30;
                  puVar32 = puVar30;
                }
              }
              uVar16 = 0;
              iVar17 = 0;
              uVar26 = uVar25;
              bVar18 = 0 < iVar14;
              if (0 < iVar14) {
                do {
                  if ((int)(uVar16 | 3) < iVar14) {
                    local_118 = *puVar28;
                    local_110 = *puVar30;
                    local_108 = *puVar32;
                    local_100 = *puVar23;
                  }
                  else {
                    lVar31 = 0;
                    do {
                      iVar17 = ~uVar16 + iVar14;
                      if ((int)lVar31 < (int)(~uVar16 + iVar14)) {
                        iVar17 = (int)lVar31;
                      }
                      lVar21 = (long)iVar17;
                      *(undefined2 *)((long)&local_118 + lVar31 * 2) =
                           *(undefined2 *)((long)puVar28 + lVar21 * 2);
                      *(undefined2 *)((long)&local_110 + lVar31 * 2) =
                           *(undefined2 *)((long)puVar30 + lVar21 * 2);
                      *(undefined2 *)((long)&local_108 + lVar31 * 2) =
                           *(undefined2 *)((long)puVar32 + lVar21 * 2);
                      *(undefined2 *)((long)&local_100 + lVar31 * 2) =
                           *(undefined2 *)((long)puVar23 + lVar21 * 2);
                      lVar31 = lVar31 + 1;
                    } while (lVar31 != 4);
                  }
                  uVar2 = peVar5[lVar24].p_linear;
                  if (uVar2 != '\0') {
                    lVar31 = 0;
                    do {
                      *(uint16_t *)((long)&local_118 + lVar31 * 2) =
                           exrcore_expTable[*(ushort *)((long)&local_118 + lVar31 * 2)];
                      lVar31 = lVar31 + 1;
                    } while (lVar31 != 0x10);
                  }
                  puVar28 = puVar28 + 1;
                  puVar30 = puVar30 + 1;
                  puVar32 = puVar32 + 1;
                  puVar23 = puVar23 + 1;
                  lVar31 = 0;
                  do {
                    uVar40 = *(ushort *)((long)&local_118 + lVar31 * 2);
                    if ((~uVar40 & 0x7c00) == 0) {
                      *(undefined2 *)((long)local_78 + lVar31 * 2) = 0x8000;
                    }
                    else {
                      if ((short)uVar40 < 0) {
                        uVar40 = ~uVar40;
                      }
                      else {
                        uVar40 = uVar40 | 0x8000;
                      }
                      *(ushort *)((long)local_78 + lVar31 * 2) = uVar40;
                    }
                    lVar31 = lVar31 + 1;
                  } while (lVar31 != 0x10);
                  lVar31 = 0;
                  auVar43 = (undefined1  [16])0x0;
                  do {
                    auVar38 = psubusw(*(undefined1 (*) [16])((long)local_78 + lVar31 * 2),auVar43);
                    auVar36._0_2_ = auVar38._0_2_ + auVar43._0_2_;
                    auVar36._2_2_ = auVar38._2_2_ + auVar43._2_2_;
                    auVar36._4_2_ = auVar38._4_2_ + auVar43._4_2_;
                    auVar36._6_2_ = auVar38._6_2_ + auVar43._6_2_;
                    auVar36._8_2_ = auVar38._8_2_ + auVar43._8_2_;
                    auVar36._10_2_ = auVar38._10_2_ + auVar43._10_2_;
                    auVar39._12_2_ = auVar38._12_2_ + auVar43._12_2_;
                    auVar39._0_12_ = auVar36;
                    auVar39._14_2_ = auVar38._14_2_ + auVar43._14_2_;
                    lVar31 = lVar31 + 8;
                    auVar43 = auVar39;
                  } while (lVar31 != 0x10);
                  auVar42._4_4_ = auVar39._12_4_;
                  auVar42._0_4_ = auVar36._8_4_;
                  auVar42._8_4_ = auVar36._8_4_;
                  auVar42._12_4_ = auVar39._12_4_;
                  auVar43 = psubusw(auVar42,auVar39);
                  sVar41 = auVar43._0_2_ + auVar36._0_2_;
                  sVar46 = auVar43._2_2_ + auVar36._2_2_;
                  sVar47 = auVar43._4_2_ + auVar36._4_2_;
                  sVar49 = auVar43._6_2_ + auVar36._6_2_;
                  auVar44._0_8_ = CONCAT26(sVar49,CONCAT24(sVar47,CONCAT22(sVar46,sVar41)));
                  auVar44._8_2_ = auVar43._8_2_ + auVar36._8_2_;
                  auVar44._10_2_ = auVar43._10_2_ + auVar36._10_2_;
                  auVar44._12_2_ = auVar43._12_2_ + auVar39._12_2_;
                  auVar44._14_2_ = auVar43._14_2_ + auVar39._14_2_;
                  uVar48 = (undefined4)((ulong)auVar44._0_8_ >> 0x20);
                  auVar43._4_4_ = uVar48;
                  auVar43._0_4_ = uVar48;
                  auVar43._8_4_ = uVar48;
                  auVar43._12_4_ = uVar48;
                  auVar43 = psubusw(auVar43,auVar44);
                  sVar41 = auVar43._0_2_ + sVar41;
                  uVar40 = auVar43._2_2_ + sVar46;
                  auVar37._0_8_ =
                       CONCAT26(auVar43._6_2_ + sVar49,
                                CONCAT24(auVar43._4_2_ + sVar47,CONCAT22(uVar40,sVar41)));
                  auVar37._8_2_ = auVar43._8_2_ + auVar44._8_2_;
                  auVar37._10_2_ = auVar43._10_2_ + auVar44._10_2_;
                  auVar38._12_2_ = auVar43._12_2_ + auVar44._12_2_;
                  auVar38._0_12_ = auVar37;
                  auVar38._14_2_ = auVar43._14_2_ + auVar44._14_2_;
                  auVar45._2_2_ = 0;
                  auVar45._0_2_ = uVar40;
                  auVar45._4_4_ = (uint)((ulong)auVar37._0_8_ >> 0x30);
                  auVar45._8_4_ = auVar37._8_4_ >> 0x10;
                  auVar45._12_4_ = auVar38._12_4_ >> 0x10;
                  auVar43 = psubusw(auVar45,auVar38);
                  uVar40 = auVar43._0_2_ + sVar41;
                  uVar3 = (uint)uVar40;
                  iVar17 = -1;
                  do {
                    iVar1 = iVar17 + 1;
                    bVar10 = (byte)iVar1;
                    uVar12 = iVar17 + 2;
                    uVar19 = ~(-1 << (bVar10 & 0x1f));
                    lVar31 = 0;
                    do {
                      uVar25 = *(ulong *)((long)local_78 + lVar31 * 2);
                      uVar50 = (ushort)(uVar25 >> 0x30);
                      auVar7._8_4_ = 0;
                      auVar7._0_8_ = uVar25;
                      auVar7._12_2_ = uVar50;
                      auVar8._8_2_ = (short)(uVar25 >> 0x20);
                      auVar8._0_8_ = uVar25;
                      auVar8._10_4_ = auVar7._10_4_;
                      auVar9._6_8_ = 0;
                      auVar9._0_6_ = auVar8._8_6_;
                      uVar13 = (uVar3 - (ushort)uVar25) * 2;
                      uVar22 = (uVar3 - (int)CONCAT82(SUB148(auVar9 << 0x40,6),
                                                      (short)(uVar25 >> 0x10))) * 2;
                      uVar29 = (uVar3 - auVar8._8_4_) * 2;
                      uVar33 = (uVar3 - uVar50) * 2;
                      uVar25 = (ulong)uVar12;
                      local_b8[lVar31] =
                           (int)(uVar13 + uVar19 + (uVar13 >> uVar25 & 1)) >> ZEXT416(uVar12);
                      local_b8[lVar31 + 1] =
                           (int)(uVar22 + uVar19 + (uVar22 >> uVar25 & 1)) >> ZEXT416(uVar12);
                      local_b8[lVar31 + 2] =
                           (int)(uVar29 + uVar19 + (uVar29 >> uVar25 & 1)) >> ZEXT416(uVar12);
                      local_b8[lVar31 + 3] =
                           (int)(uVar33 + uVar19 + (uVar33 >> uVar25 & 1)) >> ZEXT416(uVar12);
                      lVar31 = lVar31 + 4;
                    } while (lVar31 != 0x10);
                    uVar33 = local_b8[0] - local_b8[4];
                    local_48 = (ulong)uVar33;
                    uVar13 = local_b8[4] - local_b8[8];
                    local_40 = (ulong)uVar13;
                    local_f8[1] = uVar13 + 0x20;
                    local_f8[2] = (local_b8[8] - local_b8[0xc]) + 0x20;
                    local_f8[3] = (local_b8[0] - local_b8[1]) + 0x20;
                    local_f8[4] = (local_b8[4] - local_b8[5]) + 0x20;
                    uVar22 = local_b8[8] - local_b8[9];
                    local_f8[5] = uVar22 + 0x20;
                    local_f8[6] = (local_b8[0xc] - local_b8[0xd]) + 0x20;
                    local_f8[7] = (local_b8[1] - local_b8[2]) + 0x20;
                    local_f8[8] = (local_b8[5] - local_b8[6]) + 0x20;
                    local_f8[9] = (local_b8[9] - local_b8[10]) + 0x20;
                    local_f8[10] = (local_b8[0xd] - local_b8[0xe]) + 0x20;
                    local_f8[0xb] = (local_b8[2] - local_b8[3]) + 0x20;
                    local_f8[0xc] = (local_b8[6] - local_b8[7]) + 0x20;
                    uVar29 = local_b8[10] - local_b8[0xb];
                    local_38 = (ulong)uVar29;
                    local_f8[0xd] = uVar29 + 0x20;
                    local_f8[0xe] = (local_b8[0xe] - local_b8[0xf]) + 0x20;
                    local_f8[0] = uVar33 + 0x20;
                    lVar31 = 1;
                    uVar12 = local_f8[0];
                    uVar19 = local_f8[0];
                    do {
                      uVar4 = local_f8[lVar31];
                      if ((int)uVar4 <= (int)uVar19) {
                        uVar19 = uVar4;
                      }
                      if ((int)uVar4 < (int)uVar12) {
                        uVar4 = uVar12;
                      }
                      uVar12 = uVar4;
                      lVar31 = lVar31 + 1;
                    } while (lVar31 != 0xf);
                    iVar17 = iVar1;
                  } while (((int)uVar19 < 0) || (0x3f < (int)uVar12));
                  if ((flat_field == 0) || ((uVar19 != 0x20 || (uVar12 != 0x20)))) {
                    if (uVar2 == '\0') {
                      local_78[0]._0_2_ = uVar40 - (short)(local_b8[0] << (bVar10 & 0x1f));
                    }
                    *(char *)__dest = (char)((ushort)local_78[0] >> 8);
                    *(char *)((long)__dest + 1) = (char)(ushort)local_78[0];
                    *(byte *)(__dest + 1) = (byte)(local_f8[0] >> 4) | bVar10 * '\x04';
                    *(byte *)((long)__dest + 3) = (byte)(uVar13 + 0x20 >> 2) | (char)uVar33 * '\x10'
                    ;
                    *(byte *)(__dest + 2) = (byte)local_f8[2] | (char)uVar13 * '@';
                    *(byte *)((long)__dest + 5) =
                         (byte)(local_f8[4] >> 4) | (char)local_f8[3] * '\x04';
                    *(byte *)(__dest + 3) =
                         (byte)(uVar22 + 0x20 >> 2) | (char)(local_b8[4] - local_b8[5]) * '\x10';
                    *(byte *)((long)__dest + 7) = (byte)local_f8[6] | (char)uVar22 * '@';
                    *(byte *)(__dest + 4) = (byte)(local_f8[8] >> 4) | (char)local_f8[7] * '\x04';
                    *(byte *)((long)__dest + 9) =
                         (byte)(local_f8[9] >> 2) | (char)(local_b8[5] - local_b8[6]) * '\x10';
                    *(byte *)(__dest + 5) =
                         (byte)local_f8[10] | (char)(local_b8[9] - local_b8[10]) * '@';
                    *(byte *)((long)__dest + 0xb) =
                         (byte)(local_f8[0xc] >> 4) | (char)local_f8[0xb] * '\x04';
                    *(byte *)(__dest + 6) =
                         (byte)(uVar29 + 0x20 >> 2) | (char)(local_b8[6] - local_b8[7]) * '\x10';
                    bVar10 = (byte)local_f8[0xe] | (char)uVar29 * '@';
                    lVar31 = 0xe;
                    lVar21 = 0xd;
                    local_58 = (ulong)uVar22;
                  }
                  else {
                    *__dest = (ushort)local_78[0] << 8 | (ushort)local_78[0] >> 8;
                    lVar31 = 3;
                    bVar10 = 0xfc;
                    lVar21 = 2;
                  }
                  *(byte *)((long)__dest + lVar21) = bVar10;
                  __dest = (ushort *)((long)__dest + lVar31);
                  uVar25 = lVar31 + uVar26;
                  local_50 = puVar23;
                  if (encode->compressed_alloc_size < lVar31 + uVar26 + 0xe) {
                    iVar17 = 1;
                    goto LAB_00105b9c;
                  }
                  uVar16 = uVar16 + 4;
                  uVar26 = uVar25;
                  bVar18 = (int)uVar16 < iVar14;
                } while ((int)uVar16 < iVar14);
                iVar17 = 0;
              }
LAB_00105b9c:
              if (bVar18) goto LAB_00105bc0;
              uVar15 = uVar15 + 4;
            } while (uVar15 < uVar20);
            iVar17 = 0xb;
          }
LAB_00105bc0:
          iVar14 = 0;
          if (iVar17 != 0xb) {
            sVar34 = 0;
            iVar14 = iVar17;
          }
          local_1c0 = (void *)((long)local_1c0 + sVar34);
        }
        else if (encode->compressed_alloc_size < sVar34 + uVar25) {
          iVar14 = 1;
        }
        else {
          iVar14 = 10;
          memcpy(__dest,local_1c0,sVar34);
          __dest = (ushort *)((long)__dest + sVar34);
          local_1c0 = (void *)((long)local_1c0 + sVar34);
          uVar25 = sVar34 + uVar25;
        }
        if ((iVar14 != 10) && (iVar14 != 0)) break;
        lVar24 = lVar24 + 1;
        bVar6 = lVar24 < encode->channel_count;
      } while (lVar24 < encode->channel_count);
    }
    eVar11 = 1;
    if (!bVar6) {
      encode->compressed_bytes = uVar25;
      eVar11 = 0;
    }
  }
  return eVar11;
}

Assistant:

static exr_result_t
compress_b44_impl (exr_encode_pipeline_t* encode, int flat_field)
{
    uint8_t*       out  = (uint8_t*) encode->compressed_buffer;
    uint64_t       nOut = 0;
    uint8_t *      scratch, *tmp;
    const uint8_t* packed;
    int            nx, ny, wcount;
    uint64_t       bpl, nBytes;
    exr_result_t   rv;

    rv = internal_encode_alloc_buffer (
        encode,
        EXR_TRANSCODE_BUFFER_SCRATCH1,
        &(encode->scratch_buffer_1),
        &(encode->scratch_alloc_size_1),
        encode->packed_bytes);
    if (rv != EXR_ERR_SUCCESS) return rv;

    nOut   = 0;
    packed = (const uint8_t*) encode->packed_buffer;
    for (int y = 0; y < encode->chunk.height; ++y)
    {
        int cury = y + encode->chunk.start_y;

        scratch = (uint8_t*) encode->scratch_buffer_1;
        for (int c = 0; c < encode->channel_count; ++c)
        {
            const exr_coding_channel_info_t* curc = encode->channels + c;

            nx     = curc->width;
            ny     = curc->height;
            bpl    = ((uint64_t) (nx)) * (uint64_t) (curc->bytes_per_element);
            nBytes = ((uint64_t) (ny)) * bpl;

            if (nBytes == 0) continue;

            tmp = scratch;
            if (curc->y_samples > 1)
            {
                if ((cury % curc->y_samples) != 0)
                {
                    scratch += nBytes;
                    continue;
                }
                tmp += ((uint64_t) (y / curc->y_samples)) * bpl;
            }
            else { tmp += ((uint64_t) y) * bpl; }

            memcpy (tmp, packed, bpl);
            if (curc->data_type == EXR_PIXEL_HALF) priv_to_native16 (tmp, nx);
            packed += bpl;
            scratch += nBytes;
        }
    }

    nOut    = 0;
    scratch = (uint8_t*) encode->scratch_buffer_1;
    for (int c = 0; c < encode->channel_count; ++c)
    {
        const exr_coding_channel_info_t* curc = encode->channels + c;

        nx     = curc->width;
        ny     = curc->height;
        bpl    = (uint64_t) (nx) * (uint64_t) (curc->bytes_per_element);
        nBytes = ((uint64_t) (ny)) * bpl;

        if (nBytes == 0) continue;

        if (curc->data_type != EXR_PIXEL_HALF)
        {
            if (nOut + nBytes > encode->compressed_alloc_size)
                return EXR_ERR_OUT_OF_MEMORY;
            memcpy (out, scratch, nBytes);
            out += nBytes;
            scratch += nBytes;
            nOut += nBytes;
            continue;
        }

        for (int y = 0; y < ny; y += 4)
        {
            //
            // Copy the next 4x4 pixel block into array s.
            // If the width, cd.nx, or the height, cd.ny, of
            // the pixel data in _tmpBuffer is not divisible
            // by 4, then pad the data by repeating the
            // rightmost column and the bottom row.
            //

            uint16_t* row0 = (uint16_t*) scratch;
            row0 += y * nx;
            uint16_t* row1 = row0 + nx;
            uint16_t* row2 = row1 + nx;
            uint16_t* row3 = row2 + nx;

            if (y + 3 >= ny)
            {
                if (y + 1 >= ny) row1 = row0;
                if (y + 2 >= ny) row2 = row1;

                row3 = row2;
            }

            for (int x = 0; x < nx; x += 4)
            {
                uint16_t s[16];

                if (x + 3 >= nx)
                {
                    int n = nx - x;

                    for (int i = 0; i < 4; ++i)
                    {
                        int j = i;
                        if (j > n - 1) j = n - 1;

                        s[i + 0]  = row0[j];
                        s[i + 4]  = row1[j];
                        s[i + 8]  = row2[j];
                        s[i + 12] = row3[j];
                    }
                }
                else
                {
                    memcpy (&s[0], row0, 4 * sizeof (uint16_t));
                    memcpy (&s[4], row1, 4 * sizeof (uint16_t));
                    memcpy (&s[8], row2, 4 * sizeof (uint16_t));
                    memcpy (&s[12], row3, 4 * sizeof (uint16_t));
                }

                row0 += 4;
                row1 += 4;
                row2 += 4;
                row3 += 4;

                //
                // Compress the contents of array s and append the
                // results to the output buffer.
                //

                if (curc->p_linear) convertFromLinear (s);

                wcount = pack (s, out, flat_field, !(curc->p_linear));
                out += wcount;
                nOut += (uint64_t) wcount;
                if (nOut + 14 > encode->compressed_alloc_size)
                    return EXR_ERR_OUT_OF_MEMORY;
            }
        }
        scratch += nBytes;
    }

    encode->compressed_bytes = nOut;
    return rv;
}